

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86.cpp
# Opt level: O1

int __thiscall
ncnn::DeformableConv2D_x86::forward
          (DeformableConv2D_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat *pMVar3;
  size_t _elemsize;
  _func_int *p_Var4;
  Mat *this_00;
  int *piVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  Option *pOVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  uint _w;
  _func_int **pp_Var17;
  int iVar18;
  float *pfVar19;
  int iVar20;
  uint _h;
  int iVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  void *pvVar27;
  _func_int **pp_Var28;
  uint uVar29;
  bool bVar30;
  float __x;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  ulong local_2b0;
  ulong local_2a0;
  Mat local_298;
  int local_24c;
  Mat local_248;
  ulong local_200;
  int local_1f4;
  float local_1f0;
  float local_1ec;
  float local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1d8;
  ulong local_1d0;
  _func_int **local_1c8;
  pointer local_1c0;
  Mat local_1b8;
  Mat *local_170;
  Option *local_168;
  ulong local_160;
  ulong local_158;
  void *local_150;
  long local_148;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_140;
  _func_int **local_138;
  pointer local_130;
  void *local_128;
  void *local_120;
  DeformableConv2D_x86 *local_118;
  _func_int **local_110;
  undefined1 local_108 [16];
  Mat local_f8;
  Mat local_a8;
  float local_58;
  undefined1 local_48 [16];
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_1c0 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  local_200 = (ulong)(uint)pMVar3->w;
  iVar1 = pMVar3->h;
  iVar2 = pMVar3->c;
  _elemsize = pMVar3->elemsize;
  p_Var4 = this->_vptr_DeformableConv2D_x86[-3];
  uVar10 = (long)(~((*(int *)(&this->field_0xd4 + (long)p_Var4) + -1) *
                   *(int *)(&this->field_0xdc + (long)p_Var4)) + pMVar3->w +
                  *(int *)(&this->field_0xec + (long)p_Var4) +
                 *(int *)(&this->field_0xf0 + (long)p_Var4)) /
           (long)*(int *)(&this->field_0xe4 + (long)p_Var4);
  local_158 = uVar10 & 0xffffffff;
  iVar15 = (~((*(int *)(&this->field_0xd8 + (long)p_Var4) + -1) *
             *(int *)(&this->field_0xe0 + (long)p_Var4)) + iVar1 +
            *(int *)(&this->field_0xf4 + (long)p_Var4) + *(int *)(&this->field_0xf8 + (long)p_Var4))
           / *(int *)(&this->field_0xe8 + (long)p_Var4);
  _w = (int)uVar10 + 1;
  local_248.cstep = 0;
  local_248.data = (void *)0x0;
  local_248.refcount._0_4_ = 0;
  local_248.refcount._4_4_ = 0;
  local_248.elemsize._0_4_ = 0;
  local_248.elemsize._4_4_ = 0;
  local_248.elempack = 0;
  local_248.allocator = (Allocator *)0x0;
  local_248.dims = 0;
  local_248.w = 0;
  local_248.h = 0;
  local_248.d = 0;
  local_248.c = 0;
  p_Var4 = this->_vptr_DeformableConv2D_x86[-3];
  _h = iVar15 + 1;
  local_24c = _h * _w;
  local_1d8 = top_blobs;
  local_140 = bottom_blobs;
  Mat::create(&local_248,
              local_24c * iVar2 * *(int *)(&this->field_0xd8 + (long)p_Var4) *
              *(int *)(&this->field_0xd4 + (long)p_Var4),_elemsize,opt->blob_allocator);
  iVar18 = -100;
  if ((local_248.data != (void *)0x0) && ((long)local_248.c * local_248.cstep != 0)) {
    this_00 = (local_1d8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_00,*(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86[-3]),
                local_24c,_elemsize,opt->blob_allocator);
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      iVar18 = iVar1 * (int)local_200;
      Mat::reshape(&local_a8,pMVar3,iVar18 * iVar2,(Allocator *)0x0);
      local_170 = this_00;
      local_168 = opt;
      Mat::reshape(&local_f8,pMVar3 + 1,pMVar3[1].h * pMVar3[1].w * pMVar3[1].c,(Allocator *)0x0);
      if (-1 < iVar15) {
        local_1c0 = (pointer)((long)local_1c0 - (long)pMVar3);
        local_120 = local_a8.data;
        local_128 = local_f8.data;
        fVar40 = (float)iVar1;
        local_150 = local_248.data;
        fVar41 = (float)(int)local_200;
        local_1f4 = (int)local_200 + -1;
        local_1d0 = (ulong)_w;
        local_160 = (ulong)_h;
        local_1c8 = this->_vptr_DeformableConv2D_x86;
        local_2a0 = 0;
        local_1f0 = fVar41;
        local_1ec = fVar40;
        local_118 = this;
        do {
          if (-1 < (int)local_158) {
            local_148 = local_2a0 * local_1d0;
            pp_Var17 = this->_vptr_DeformableConv2D_x86;
            local_2b0 = 0;
            local_138 = pp_Var17;
            do {
              if (0 < *(int *)(&this->field_0xd8 + (long)local_1c8[-3])) {
                p_Var4 = local_1c8[-3];
                local_1e0 = *(int *)(&this->field_0xe8 + (long)p_Var4) * (int)local_2a0 -
                            *(int *)(&this->field_0xf4 + (long)p_Var4);
                iVar21 = (int)local_2b0;
                local_1e4 = *(int *)(&this->field_0xe4 + (long)p_Var4) * iVar21 -
                            *(int *)(&this->field_0xec + (long)p_Var4);
                pfVar19 = (float *)((long)local_150 +
                                   (long)(((int)local_148 + iVar21) * iVar2 *
                                          *(int *)(&this->field_0xd8 + (long)p_Var4) *
                                         *(int *)(&this->field_0xd4 + (long)p_Var4)) * 4);
                pp_Var28 = this->_vptr_DeformableConv2D_x86;
                iVar15 = 0;
                local_110 = pp_Var28;
                do {
                  iVar14 = *(int *)(&this->field_0xd4 + (long)pp_Var17[-3]);
                  if (0 < iVar14) {
                    local_130 = (local_140->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_start;
                    iVar20 = 0;
                    local_1dc = iVar15;
                    do {
                      iVar15 = iVar14 * local_1dc + iVar20;
                      fVar42 = 1.0;
                      if (local_1c0 == (pointer)0xd8) {
                        fVar42 = *(float *)((long)local_130[2].data +
                                           local_2b0 * 4 +
                                           (long)local_130[2].w * local_2a0 * local_130[2].elemsize
                                           + (long)iVar15 * local_130[2].cstep *
                                             local_130[2].elemsize);
                      }
                      __x = (float)(*(int *)(&this->field_0xe0 + (long)pp_Var28[-3]) * local_1dc +
                                   local_1e0) +
                            *(float *)((long)local_128 +
                                      (long)(int)((iVar15 * 2 * _h + (int)local_2a0) * _w + iVar21)
                                      * 4);
                      fVar35 = (float)(*(int *)(&this->field_0xdc + (long)pp_Var28[-3]) * iVar20 +
                                      local_1e4) +
                               *(float *)((long)local_128 +
                                         (long)(int)(((iVar15 * 2 + 1) * _h + (int)local_2a0) * _w +
                                                    iVar21) * 4);
                      bVar8 = fVar40 <= __x;
                      bVar9 = fVar41 <= fVar35;
                      if ((bVar9 || bVar8) || (fVar35 <= -1.0 || __x <= -1.0)) {
                        fVar31 = 0.0;
                        fVar32 = 0.0;
                        fVar33 = 0.0;
                        fVar34 = 0.0;
                        bVar30 = false;
                        bVar12 = false;
                        bVar11 = false;
                        bVar16 = false;
                        lVar22 = 0;
                        lVar23 = 0;
                        lVar25 = 0;
                        lVar26 = 0;
                      }
                      else {
                        local_48 = ZEXT416((uint)__x);
                        local_108 = ZEXT416((uint)fVar35);
                        local_1e8 = fVar42;
                        local_58 = floorf(__x);
                        uVar29 = (uint)local_58;
                        fVar40 = floorf((float)local_108._0_4_);
                        uVar24 = (uint)fVar40;
                        fVar41 = (float)local_48._0_4_ - (float)(int)local_58;
                        fVar40 = (float)local_108._0_4_ - (float)(int)uVar24;
                        bVar6 = (int)uVar24 < local_1f4;
                        bVar12 = -1 < (int)uVar29 && bVar6;
                        bVar7 = (int)uVar29 < iVar1 + -1;
                        bVar11 = -1 < (int)uVar24 && bVar7;
                        bVar16 = bVar7 && bVar6;
                        iVar15 = (int)local_200 * uVar29;
                        bVar30 = -1 < (int)(uVar29 | uVar24);
                        lVar22 = (long)(int)(iVar15 + uVar24);
                        if (!bVar30) {
                          lVar22 = 0;
                        }
                        lVar23 = (long)(int)(iVar15 + uVar24 + 1);
                        if (-1 >= (int)uVar29 || !bVar6) {
                          lVar23 = 0;
                        }
                        iVar15 = (uVar29 + 1) * (int)local_200;
                        lVar25 = (long)(int)(uVar24 + iVar15);
                        if (-1 >= (int)uVar24 || !bVar7) {
                          lVar25 = 0;
                        }
                        lVar26 = (long)(int)(iVar15 + uVar24 + 1);
                        if (!bVar7 || !bVar6) {
                          lVar26 = 0;
                        }
                        fVar31 = (1.0 - fVar40) * fVar41;
                        fVar32 = fVar41 * fVar40;
                        fVar33 = fVar40 * (1.0 - fVar41);
                        fVar34 = (1.0 - fVar41) * (1.0 - fVar40);
                        fVar40 = local_1ec;
                        fVar41 = local_1f0;
                        fVar42 = local_1e8;
                      }
                      pvVar27 = local_120;
                      iVar15 = iVar2;
                      if (0 < iVar2) {
                        do {
                          fVar36 = 0.0;
                          if ((!bVar9 && !bVar8) && (fVar35 > -1.0 && __x > -1.0)) {
                            fVar37 = 0.0;
                            if (bVar30) {
                              fVar37 = *(float *)((long)pvVar27 + lVar22 * 4);
                            }
                            if (bVar12) {
                              fVar36 = *(float *)((long)pvVar27 + lVar23 * 4);
                            }
                            fVar39 = 0.0;
                            fVar38 = 0.0;
                            if (bVar11) {
                              fVar38 = *(float *)((long)pvVar27 + lVar25 * 4);
                            }
                            if (bVar16) {
                              fVar39 = *(float *)((long)pvVar27 + lVar26 * 4);
                            }
                            fVar36 = fVar37 * fVar34 + fVar39 * fVar32 +
                                     fVar36 * fVar33 + fVar38 * fVar31;
                          }
                          *pfVar19 = fVar36 * fVar42;
                          pfVar19 = pfVar19 + 1;
                          pvVar27 = (void *)((long)pvVar27 + (long)iVar18 * 4);
                          iVar15 = iVar15 + -1;
                        } while (iVar15 != 0);
                      }
                      iVar20 = iVar20 + 1;
                      iVar14 = *(int *)(&local_118->field_0xd4 + (long)local_110[-3]);
                      pp_Var28 = local_110;
                      this = local_118;
                      iVar15 = local_1dc;
                    } while (iVar20 < iVar14);
                  }
                  iVar15 = iVar15 + 1;
                  pp_Var17 = local_138;
                } while (iVar15 < *(int *)(&this->field_0xd8 + (long)local_138[-3]));
              }
              local_2b0 = local_2b0 + 1;
            } while (local_2b0 != local_1d0);
          }
          local_2a0 = local_2a0 + 1;
        } while (local_2a0 != local_160);
      }
      Mat::reshape(&local_298,&local_248,
                   iVar2 * *(int *)(&this->field_0xd8 + (long)this->_vptr_DeformableConv2D_x86[-3])
                   * *(int *)(&this->field_0xd4 + (long)this->_vptr_DeformableConv2D_x86[-3]),
                   local_24c,(Allocator *)0x0);
      pOVar13 = local_168;
      pMVar3 = local_170;
      piVar5 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_248.allocator == (Allocator *)0x0) {
            if (local_248.data != (void *)0x0) {
              free(local_248.data);
            }
          }
          else {
            (*(local_248.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
      local_248.data = local_298.data;
      local_248.refcount._0_4_ = local_298.refcount._0_4_;
      local_248.refcount._4_4_ = local_298.refcount._4_4_;
      local_248.elemsize._0_4_ = (undefined4)local_298.elemsize;
      local_248.elemsize._4_4_ = local_298.elemsize._4_4_;
      local_248.elempack = local_298.elempack;
      local_248.allocator = local_298.allocator;
      local_248.dims = local_298.dims;
      local_248.w = local_298.w;
      local_248.h = local_298.h;
      local_248.d = local_298.d;
      local_248.c = local_298.c;
      local_248.cstep = local_298.cstep;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_298.allocator == (Allocator *)0x0) {
            if (local_298.data != (void *)0x0) {
              free(local_298.data);
            }
          }
          else {
            (*(local_298.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_298.cstep = 0;
      local_298.data = (void *)0x0;
      local_298.refcount._0_4_ = 0;
      local_298.refcount._4_4_ = 0;
      local_298.elemsize._0_4_ = 0;
      local_298.elemsize._4_4_ = 0;
      local_298.elempack = 0;
      local_298.dims = 0;
      local_298.w = 0;
      local_298.h = 0;
      local_298.d = 0;
      local_298.c = 0;
      (*this->inner_product->_vptr_Layer[7])(this->inner_product,&local_248,pMVar3,pOVar13);
      local_298.cstep = 0;
      local_298.data = (void *)0x0;
      local_298.refcount._0_4_ = 0;
      local_298.refcount._4_4_ = 0;
      local_298.elemsize._0_4_ = 0;
      local_298.elemsize._4_4_ = 0;
      local_298.elempack = 0;
      local_298.allocator = (Allocator *)0x0;
      local_298.dims = 0;
      local_298.w = 0;
      local_298.h = 0;
      local_298.d = 0;
      local_298.c = 0;
      (*this->permute->_vptr_Layer[7])(this->permute,pMVar3,&local_298,pOVar13);
      Mat::reshape(&local_1b8,&local_298,_w,_h,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86[-3]),
                   (Allocator *)0x0);
      piVar5 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_298.allocator == (Allocator *)0x0) {
            if (local_298.data != (void *)0x0) {
              free(local_298.data);
            }
          }
          else {
            (*(local_298.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      local_298.data = local_1b8.data;
      local_298.refcount._0_4_ = local_1b8.refcount._0_4_;
      local_298.refcount._4_4_ = local_1b8.refcount._4_4_;
      local_298.elemsize._0_4_ = (undefined4)local_1b8.elemsize;
      local_298.elemsize._4_4_ = local_1b8.elemsize._4_4_;
      local_298.elempack = local_1b8.elempack;
      local_298.allocator = local_1b8.allocator;
      local_298.dims = local_1b8.dims;
      local_298.w = local_1b8.w;
      local_298.h = local_1b8.h;
      local_298.d = local_1b8.d;
      local_298.c = local_1b8.c;
      local_298.cstep = local_1b8.cstep;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_1b8.allocator == (Allocator *)0x0) {
            if (local_1b8.data != (void *)0x0) {
              free(local_1b8.data);
            }
          }
          else {
            (*(local_1b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_1b8.cstep = 0;
      local_1b8.data = (void *)0x0;
      local_1b8.refcount._0_4_ = 0;
      local_1b8.refcount._4_4_ = 0;
      local_1b8.elemsize._0_4_ = 0;
      local_1b8.elemsize._4_4_ = 0;
      local_1b8.elempack = 0;
      local_1b8.dims = 0;
      local_1b8.w = 0;
      local_1b8.h = 0;
      local_1b8.d = 0;
      local_1b8.c = 0;
      pMVar3 = (local_1d8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pMVar3 != &local_298) {
        piVar5 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = pMVar3->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (pMVar3->allocator == (Allocator *)0x0) {
              if (pMVar3->data != (void *)0x0) {
                free(pMVar3->data);
              }
            }
            else {
              (*pMVar3->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar3->cstep = 0;
        pMVar3->data = (void *)0x0;
        pMVar3->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
        pMVar3->dims = 0;
        pMVar3->w = 0;
        pMVar3->h = 0;
        pMVar3->d = 0;
        pMVar3->c = 0;
        pMVar3->data = local_298.data;
        pMVar3->refcount = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
        pMVar3->elemsize = CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize);
        pMVar3->elempack = local_298.elempack;
        pMVar3->allocator = local_298.allocator;
        pMVar3->dims = local_298.dims;
        pMVar3->w = local_298.w;
        pMVar3->h = local_298.h;
        pMVar3->d = local_298.d;
        pMVar3->c = local_298.c;
        pMVar3->cstep = local_298.cstep;
      }
      piVar5 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_298.allocator == (Allocator *)0x0) {
            if (local_298.data != (void *)0x0) {
              free(local_298.data);
            }
          }
          else {
            (*(local_298.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_298.cstep = 0;
      local_298.data = (void *)0x0;
      local_298.refcount._0_4_ = 0;
      local_298.refcount._4_4_ = 0;
      local_298.elemsize._0_4_ = 0;
      local_298.elemsize._4_4_ = 0;
      local_298.elempack = 0;
      local_298.dims = 0;
      local_298.w = 0;
      local_298.h = 0;
      local_298.d = 0;
      local_298.c = 0;
      if (local_f8.refcount != (int *)0x0) {
        LOCK();
        *local_f8.refcount = *local_f8.refcount + -1;
        UNLOCK();
        if (*local_f8.refcount == 0) {
          if (local_f8.allocator == (Allocator *)0x0) {
            if (local_f8.data != (void *)0x0) {
              free(local_f8.data);
            }
          }
          else {
            (*(local_f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_a8.refcount != (int *)0x0) {
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount == 0) {
          if (local_a8.allocator == (Allocator *)0x0) {
            if (local_a8.data != (void *)0x0) {
              free(local_a8.data);
            }
          }
          else {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar18 = 0;
    }
  }
  piVar5 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_248.allocator == (Allocator *)0x0) {
        if (local_248.data != (void *)0x0) {
          free(local_248.data);
        }
      }
      else {
        (*(local_248.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar18;
}

Assistant:

int DeformableConv2D_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& offset = bottom_blobs[1];

    const bool has_mask = (bottom_blobs.size() == 3);

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int in_c = bottom_blob.c;
    const size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int out_w = (w + pad_left + pad_right - kernel_extent_w) / stride_w + 1;
    const int out_h = (h + pad_top + pad_bottom - kernel_extent_h) / stride_h + 1;

    // output = im2col matmul weight_t, im2col.shape is [out_h * out_w, kernel_h * kernel_w * in_c] (in python),
    // weight_t.shape is [num_output, kernel_h * kernel_w * in_c] (in python),
    // output.shape   is [out_h * out_w, num_output] (in python).
    Mat im2col;
    im2col.create(kernel_h * kernel_w * in_c * out_h * out_w, elemsize, opt.blob_allocator);
    if (im2col.empty())
        return -100;

    Mat& output = top_blobs[0];
    output.create(num_output, out_h * out_w, elemsize, opt.blob_allocator);
    if (output.empty())
        return -100;

    Mat bottom_blob_flatten = bottom_blob.reshape(w * h * in_c);
    Mat offset_flatten = offset.reshape(offset.w * offset.h * offset.c);
    const float* data_im_ptr = bottom_blob_flatten;
    const float* data_offset_ptr = offset_flatten;
    float* im2col_ptr = im2col;

    // im2col
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int h_col = 0; h_col < out_h; h_col++)
    {
        for (int w_col = 0; w_col < out_w; w_col++)
        {
            int h_in = h_col * stride_h - pad_top;
            int w_in = w_col * stride_w - pad_left;
            float* data_col_ptr = im2col_ptr + (h_col * out_w + w_col) * kernel_h * kernel_w * in_c;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    const int data_offset_h_ptr = (((i * kernel_w + j) * 2) * out_h + h_col) * out_w + w_col;
                    const int data_offset_w_ptr = (((i * kernel_w + j) * 2 + 1) * out_h + h_col) * out_w + w_col;

                    const float offset_h = data_offset_ptr[data_offset_h_ptr];
                    const float offset_w = data_offset_ptr[data_offset_w_ptr];
                    const float mask_ = has_mask ? bottom_blobs[2].channel(i * kernel_w + j).row(h_col)[w_col] : 1.f;
                    const float h_im = h_in + i * dilation_h + offset_h;
                    const float w_im = w_in + j * dilation_w + offset_w;

                    // Bilinear
                    const bool cond = h_im > -1 && w_im > -1 && h_im < h && w_im < w;
                    float w1 = 0.f;
                    float w2 = 0.f;
                    float w3 = 0.f;
                    float w4 = 0.f;
                    bool v1_cond = false;
                    bool v2_cond = false;
                    bool v3_cond = false;
                    bool v4_cond = false;
                    int v1_pos = 0;
                    int v2_pos = 0;
                    int v3_pos = 0;
                    int v4_pos = 0;
                    if (cond)
                    {
                        int h_low = floor(h_im);
                        int w_low = floor(w_im);
                        int h_high = h_low + 1;
                        int w_high = w_low + 1;

                        float lh = h_im - h_low;
                        float lw = w_im - w_low;
                        float hh = 1 - lh;
                        float hw = 1 - lw;

                        v1_cond = (h_low >= 0 && w_low >= 0);
                        v2_cond = (h_low >= 0 && w_high <= w - 1);
                        v3_cond = (h_high <= h - 1 && w_low >= 0);
                        v4_cond = (h_high <= h - 1 && w_high <= w - 1);
                        if (v1_cond)
                            v1_pos = h_low * w + w_low;
                        if (v2_cond)
                            v2_pos = h_low * w + w_high;
                        if (v3_cond)
                            v3_pos = h_high * w + w_low;
                        if (v4_cond)
                            v4_pos = h_high * w + w_high;

                        w1 = hh * hw;
                        w2 = hh * lw;
                        w3 = lh * hw;
                        w4 = lh * lw;
                    }

                    const float* data_im_channel_ptr = data_im_ptr;
                    for (int c_im = 0; c_im < in_c; c_im++)
                    {
                        float val = 0.f;
                        if (cond)
                        {
                            float v1 = v1_cond ? data_im_channel_ptr[v1_pos] : 0.f;
                            float v2 = v2_cond ? data_im_channel_ptr[v2_pos] : 0.f;
                            float v3 = v3_cond ? data_im_channel_ptr[v3_pos] : 0.f;
                            float v4 = v4_cond ? data_im_channel_ptr[v4_pos] : 0.f;
                            val = w1 * v1 + w2 * v2 + w3 * v3 + w4 * v4;
                        }
                        *data_col_ptr = val * mask_;
                        data_col_ptr += 1;
                        data_im_channel_ptr += h * w;
                    }
                }
            }
        }
    }
    im2col = im2col.reshape(kernel_h * kernel_w * in_c, out_h * out_w);
    // call InnerProduct
    inner_product->forward(im2col, output, opt);
    ncnn::Mat output_t;
    // call Permute
    permute->forward(output, output_t, opt);
    output_t = output_t.reshape(out_w, out_h, num_output);
    top_blobs[0] = output_t;
    return 0;
}